

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *window;
  int i;
  bool hovered_window_above_modal;
  ImGuiWindow *modal;
  ImGuiContext *g;
  ImGuiWindow *in_stack_ffffffffffffffc0;
  ImGuiWindow *in_stack_ffffffffffffffd0;
  int local_28;
  ImRect local_18;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((GImGui->NavWindow == (ImGuiWindow *)0x0 || ((GImGui->NavWindow->Appearing & 1U) == 0)))) {
    if (((GImGui->IO).MouseClicked[0] & 1U) != 0) {
      if (GImGui->HoveredRootWindow == (ImGuiWindow *)0x0) {
        if ((GImGui->NavWindow != (ImGuiWindow *)0x0) &&
           (pIVar2 = GetFrontMostPopupModal(), pIVar2 == (ImGuiWindow *)0x0)) {
          FocusWindow(in_stack_ffffffffffffffc0);
        }
      }
      else {
        StartMouseMovingWindow(in_stack_ffffffffffffffc0);
        if ((((local_8->IO).ConfigWindowsMoveFromTitleBarOnly & 1U) != 0) &&
           ((local_8->HoveredRootWindow->Flags & 1U) == 0)) {
          local_18 = ImGuiWindow::TitleBarRect(in_stack_ffffffffffffffd0);
          bVar1 = ImRect::Contains(&local_18,(local_8->IO).MouseClickedPos);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            local_8->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
      }
    }
    if (((local_8->IO).MouseClicked[1] & 1U) != 0) {
      pIVar2 = GetFrontMostPopupModal();
      bVar1 = pIVar2 == (ImGuiWindow *)0x0;
      local_28 = (local_8->Windows).Size;
      while (local_28 = local_28 + -1, -1 < local_28 && !bVar1) {
        ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&local_8->Windows,local_28);
        if (*ppIVar3 == pIVar2) break;
        if (*ppIVar3 == local_8->HoveredWindow) {
          bVar1 = true;
        }
      }
      ClosePopupsOverWindow(pIVar2);
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    // Initiate moving window
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click to focus window and start moving (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        if (g.HoveredRootWindow != NULL)
        {
            StartMouseMovingWindow(g.HoveredWindow);
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(g.HoveredRootWindow->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!g.HoveredRootWindow->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;
        }
        else if (g.NavWindow != NULL && GetFrontMostPopupModal() == NULL)
        {
            FocusWindow(NULL);  // Clicking on void disable focus
        }
    }

    // With right mouse button we close popups without changing focus
    // (The left mouse button path calls FocusWindow which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the front most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetFrontMostPopupModal();
        bool hovered_window_above_modal = false;
        if (modal == NULL)
            hovered_window_above_modal = true;
        for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window == modal)
                break;
            if (window == g.HoveredWindow)
                hovered_window_above_modal = true;
        }
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal);
    }
}